

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

ExpressionNode * __thiscall DL::Parser::gr_expression(Parser *this)

{
  pointer ppDVar1;
  pointer ppDVar2;
  ExpressionNode *this_00;
  undefined1 local_48 [8];
  _Alloc_hider _Stack_40;
  pointer local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  this_00 = (ExpressionNode *)operator_new(0x38);
  (this_00->Name)._M_dataplus._M_p = (pointer)&(this_00->Name).field_2;
  (this_00->Name)._M_string_length = 0;
  (this_00->Name).field_2._M_local_buf[0] = '\0';
  (this_00->Nodes).super__Vector_base<DL::DataNode_*,_std::allocator<DL::DataNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->Nodes).super__Vector_base<DL::DataNode_*,_std::allocator<DL::DataNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->Nodes).super__Vector_base<DL::DataNode_*,_std::allocator<DL::DataNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  match((Token *)local_48,this,T_Identifier);
  std::__cxx11::string::operator=((string *)this_00,(string *)&_Stack_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Stack_40._M_p != &local_30) {
    operator_delete(_Stack_40._M_p,local_30._M_allocated_capacity + 1);
  }
  gr_data_list((vector_t<DataNode_*> *)local_48,this);
  ppDVar1 = (this_00->Nodes).super__Vector_base<DL::DataNode_*,_std::allocator<DL::DataNode_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppDVar2 = (this_00->Nodes).super__Vector_base<DL::DataNode_*,_std::allocator<DL::DataNode_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage;
  (this_00->Nodes).super__Vector_base<DL::DataNode_*,_std::allocator<DL::DataNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_48;
  (this_00->Nodes).super__Vector_base<DL::DataNode_*,_std::allocator<DL::DataNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)_Stack_40._M_p;
  (this_00->Nodes).super__Vector_base<DL::DataNode_*,_std::allocator<DL::DataNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_38;
  local_48 = (undefined1  [8])0x0;
  _Stack_40._M_p = (pointer)0x0;
  local_38 = (pointer)0x0;
  if (ppDVar1 != (pointer)0x0) {
    operator_delete(ppDVar1,(long)ppDVar2 - (long)ppDVar1);
    if (local_48 != (undefined1  [8])0x0) {
      operator_delete((void *)local_48,(long)local_38 - (long)local_48);
    }
  }
  return this_00;
}

Assistant:

ExpressionNode* Parser::gr_expression()
{
	ExpressionNode* node = new ExpressionNode;

	node->Name  = match(T_Identifier).Value;
	node->Nodes = gr_data_list();
	return node;
}